

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttribBindingTests.cpp
# Opt level: O2

long __thiscall gl4cts::anon_unknown_0::BasicInputBase::Run(BasicInputBase *this)

{
  CallLogWrapper *this_00;
  float fVar1;
  float fVar2;
  bool bVar3;
  GLuint GVar4;
  long lVar5;
  undefined **ppuVar6;
  float *pfVar7;
  long lVar8;
  int i;
  ulong uVar9;
  byte bVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  Vector<float,_4> local_450;
  char *glsl_vs;
  Vec4 data [64];
  
  bVar10 = 0;
  glsl_vs = 
  "#version 430 core\nlayout(location = 0) in vec4 vs_in_attrib[16];\nout StageData {\n  vec4 attrib[16];\n} vs_out;\nvoid main() {\n  for (int i = 0; i < vs_in_attrib.length(); ++i) {\n    vs_out.attrib[i] = vs_in_attrib[i];\n  }\n}"
  ;
  this_00 = &(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  GVar4 = glu::CallLogWrapper::glCreateProgram(this_00);
  this->m_po = GVar4;
  GVar4 = glu::CallLogWrapper::glCreateShader(this_00,0x8b31);
  glu::CallLogWrapper::glShaderSource(this_00,GVar4,1,&glsl_vs,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader(this_00,GVar4);
  glu::CallLogWrapper::glAttachShader(this_00,this->m_po,GVar4);
  glu::CallLogWrapper::glDeleteShader(this_00,GVar4);
  lVar5 = 0x10;
  ppuVar6 = &PTR_anon_var_dwarf_3b5375_01dcefb0;
  pfVar7 = data[0].m_data;
  for (; lVar5 != 0; lVar5 = lVar5 + -1) {
    *(undefined **)pfVar7 = *ppuVar6;
    ppuVar6 = ppuVar6 + (ulong)bVar10 * -2 + 1;
    pfVar7 = pfVar7 + (ulong)bVar10 * 0xfffffffffffffffc + 2;
  }
  glu::CallLogWrapper::glTransformFeedbackVaryings(this_00,this->m_po,0x10,(GLchar **)data,0x8c8c);
  glu::CallLogWrapper::glLinkProgram(this_00,this->m_po);
  bVar3 = VertexAttribBindingBase::CheckProgram(&this->super_VertexAttribBindingBase,this->m_po);
  if (bVar3) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)data,0x400,
               (allocator_type *)&local_450);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x8c8e,0,this->m_xfbo);
    glu::CallLogWrapper::glBufferData(this_00,0x8c8e,0x400,(void *)data[0].m_data._0_8_,0x88e8);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)data);
    glu::CallLogWrapper::glEnable(this_00,0x8c89);
    glu::CallLogWrapper::glUseProgram(this_00,this->m_po);
    glu::CallLogWrapper::glBeginTransformFeedback(this_00,0);
    if (this->base_instance == 0xffffffff) {
      glu::CallLogWrapper::glDrawArraysInstanced(this_00,0,0,2,this->instance_count);
    }
    else {
      glu::CallLogWrapper::glDrawArraysInstancedBaseInstance
                (this_00,0,0,2,this->instance_count,this->base_instance);
    }
    glu::CallLogWrapper::glEndTransformFeedback(this_00);
    lVar5 = 0;
    do {
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)((long)data[0].m_data + lVar5));
      lVar5 = lVar5 + 0x10;
    } while (lVar5 != 0x400);
    lVar5 = 0;
    glu::CallLogWrapper::glGetBufferSubData(this_00,0x8c8e,0,0x400,data);
    lVar8 = 0;
    for (uVar9 = 0; uVar9 != 0x40; uVar9 = uVar9 + 1) {
      tcu::Vector<float,_4>::Vector(&local_450,0.01);
      fVar1 = *(float *)((long)this->expected_data[0].m_data + lVar8);
      fVar2 = *(float *)((long)data[0].m_data + lVar8);
      if (local_450.m_data[0] < ABS(fVar1 - fVar2)) {
        fVar11 = *(float *)((long)data[0].m_data + lVar8 + 4);
        fVar14 = *(float *)((long)this->expected_data[0].m_data + lVar8 + 4);
LAB_00a7de11:
        fVar12 = *(float *)((long)data[0].m_data + lVar8 + 8);
        fVar13 = *(float *)((long)data[0].m_data + lVar8 + 0xc);
        fVar15 = *(float *)((long)this->expected_data[0].m_data + lVar8 + 8);
        fVar16 = *(float *)((long)this->expected_data[0].m_data + lVar8 + 0xc);
LAB_00a7de2d:
        anon_unknown_0::Output
                  ("Data is: %f %f %f %f, data should be: %f %f %f %f, index is: %d.\n",
                   (double)fVar2,(double)fVar11,(double)fVar12,(double)fVar13,(double)fVar1,
                   (double)fVar14,(double)fVar15,(double)fVar16,uVar9 & 0xffffffff);
        goto LAB_00a7de5e;
      }
      fVar14 = *(float *)((long)this->expected_data[0].m_data + lVar8 + 4);
      fVar11 = *(float *)((long)data[0].m_data + lVar8 + 4);
      if (local_450.m_data[1] < ABS(fVar14 - fVar11)) goto LAB_00a7de11;
      fVar15 = *(float *)((long)this->expected_data[0].m_data + lVar8 + 8);
      fVar12 = *(float *)((long)data[0].m_data + lVar8 + 8);
      if (local_450.m_data[2] < ABS(fVar15 - fVar12)) goto LAB_00a7de11;
      fVar16 = *(float *)((long)this->expected_data[0].m_data + lVar8 + 0xc);
      fVar13 = *(float *)((long)data[0].m_data + lVar8 + 0xc);
      if (local_450.m_data[3] < ABS(fVar16 - fVar13)) goto LAB_00a7de2d;
      lVar8 = lVar8 + 0x10;
    }
  }
  else {
LAB_00a7de5e:
    lVar5 = -1;
  }
  return lVar5;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_vs = "#version 430 core" NL "layout(location = 0) in vec4 vs_in_attrib[16];" NL
									"out StageData {" NL "  vec4 attrib[16];" NL "} vs_out;" NL "void main() {" NL
									"  for (int i = 0; i < vs_in_attrib.length(); ++i) {" NL
									"    vs_out.attrib[i] = vs_in_attrib[i];" NL "  }" NL "}";
		m_po = glCreateProgram();
		{
			const GLuint sh = glCreateShader(GL_VERTEX_SHADER);
			glShaderSource(sh, 1, &glsl_vs, NULL);
			glCompileShader(sh);
			glAttachShader(m_po, sh);
			glDeleteShader(sh);
		}
		{
			const GLchar* const v[16] = { "StageData.attrib[0]",  "StageData.attrib[1]",  "StageData.attrib[2]",
										  "StageData.attrib[3]",  "StageData.attrib[4]",  "StageData.attrib[5]",
										  "StageData.attrib[6]",  "StageData.attrib[7]",  "StageData.attrib[8]",
										  "StageData.attrib[9]",  "StageData.attrib[10]", "StageData.attrib[11]",
										  "StageData.attrib[12]", "StageData.attrib[13]", "StageData.attrib[14]",
										  "StageData.attrib[15]" };
			glTransformFeedbackVaryings(m_po, 16, v, GL_INTERLEAVED_ATTRIBS);
		}
		glLinkProgram(m_po);
		if (!CheckProgram(m_po))
			return ERROR;

		{
			std::vector<GLubyte> zero(sizeof(expected_data));
			glBindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_xfbo);
			glBufferData(GL_TRANSFORM_FEEDBACK_BUFFER, sizeof(expected_data), &zero[0], GL_DYNAMIC_DRAW);
		}

		glEnable(GL_RASTERIZER_DISCARD);
		glUseProgram(m_po);
		glBeginTransformFeedback(GL_POINTS);
		if (base_instance != -1)
		{
			glDrawArraysInstancedBaseInstance(GL_POINTS, 0, 2, instance_count, static_cast<GLuint>(base_instance));
		}
		else
		{
			glDrawArraysInstanced(GL_POINTS, 0, 2, instance_count);
		}
		glEndTransformFeedback();

		Vec4 data[64];
		glGetBufferSubData(GL_TRANSFORM_FEEDBACK_BUFFER, 0, sizeof(Vec4) * 64, &data[0]);

		long status = NO_ERROR;
		for (int i = 0; i < 64; ++i)
		{
			if (!ColorEqual(expected_data[i], data[i], Vec4(0.01f)))
			{
				Output("Data is: %f %f %f %f, data should be: %f %f %f %f, index is: %d.\n", data[i][0], data[i][1],
					   data[i][2], data[i][3], expected_data[i][0], expected_data[i][1], expected_data[i][2],
					   expected_data[i][3], i);
				status = ERROR;
				break;
			}
		}
		return status;
	}